

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gost89.c
# Opt level: O2

void hexdump(FILE *f,char *title,uchar *s,int l)

{
  ulong uVar1;
  
  fputs(title,(FILE *)f);
  for (uVar1 = 0; uVar1 != 0x20; uVar1 = uVar1 + 1) {
    if ((uVar1 & 0xf) == 0) {
      fprintf((FILE *)f,"\n%04x",uVar1 & 0xffffffff);
    }
    fprintf((FILE *)f," %02x",(ulong)s[uVar1]);
  }
  fputc(10,(FILE *)f);
  return;
}

Assistant:

static void hexdump(FILE *f, const char *title, const unsigned char *s, int l)
{
    int n = 0;

    fprintf(f, "%s", title);
    for (; n < l; ++n) {
        if ((n % 16) == 0)
            fprintf(f, "\n%04x", n);
        fprintf(f, " %02x", s[n]);
    }
    fprintf(f, "\n");
}